

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

LogicalCountExpr __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeBinary<mp::LogicalCountExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>> *this,Kind kind,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> lhs,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
          rhs)

{
  Impl *impl;
  LogicalCountExpr LVar1;
  AssertionFailure *this_00;
  int kind_1;
  Impl *local_28;
  
  if (kind - ATLEAST < 6) {
    if ((lhs.super_ExprBase.impl_ != (Impl *)0x0) &&
       ((ExprBase)rhs.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_
        != (ExprBase)0x0)) {
      local_28 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)(this + 8),&local_28);
      impl = (Impl *)operator_new__(0xc0);
      impl->kind_ = kind;
      *(Impl **)(*(long *)(this + 0x10) + -8) = impl;
      *(ExprBase *)&impl[2].kind_ = lhs.super_ExprBase.impl_;
      *(BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *)&impl[4].kind_ =
           rhs.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
      LVar1 = internal::ExprBase::Create<mp::LogicalCountExpr>(impl);
      return (LogicalCountExpr)
             LVar1.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_;
    }
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid argument");
  }
  else {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid expression kind");
  }
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

ExprType MakeBinary(expr::Kind kind, LHS lhs, RHS rhs) {
    MP_ASSERT(internal::Is<ExprType>(kind), "invalid expression kind");
    MP_ASSERT(lhs != 0 && rhs != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(kind);
    impl->lhs = lhs.impl_;
    impl->rhs = rhs.impl_;
    return Expr::Create<ExprType>(impl);
  }